

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_GetProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  bool bVar1;
  PropertyId propertyId;
  InlineCache *inlineCache;
  RecyclableObject *object;
  undefined1 local_88 [8];
  PropertyValueInfo info;
  Var value;
  
  inlineCache = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  bVar1 = VarIs<Js::RecyclableObject>(instance);
  if ((bVar1) &&
     (object = UnsafeVarTo<Js::RecyclableObject>(instance), object != (RecyclableObject *)0x0)) {
    local_88 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_88,*(FunctionBody **)(this + 0x88),inlineCache,
               (uint)playout->inlineCacheIndex,true);
    bVar1 = CacheOperators::
            TryGetProperty<true,false,false,false,false,false,true,false,false,false>
                      (object,false,object,propertyId,(Var *)&info.inlineCacheIndex,
                       *(ScriptContext **)(this + 0x78),(PropertyCacheOperationInfo *)0x0,
                       (PropertyValueInfo *)local_88);
    if (bVar1) {
      SetReg<unsigned_short>(this,playout->Value,(Var)info._56_8_);
      return;
    }
  }
  OP_GetProperty_NoFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
            (this,instance,playout);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetProperty(Var instance, unaligned T* playout)
    {
        InlineCache *inlineCache = GetInlineCache(playout->inlineCacheIndex);
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        RecyclableObject* obj = JavascriptOperators::TryFromVar<RecyclableObject>(instance);
        if (obj)
        {
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);

            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                obj, false, obj, propertyId, &value, GetScriptContext(), nullptr, &info))
            {
                SetReg(playout->Value, value);
                return;
            }
        }
        OP_GetProperty_NoFastPath(instance, playout);
    }